

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void jinit_color_converter(j_compress_ptr cinfo)

{
  jpeg_color_converter *pjVar1;
  my_cconvert_ptr_conflict cconvert;
  j_compress_ptr cinfo_local;
  
  pjVar1 = (jpeg_color_converter *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x18);
  cinfo->cconvert = pjVar1;
  pjVar1->start_pass = null_method;
  switch(cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1) {
      cinfo->err->msg_code = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_RGB:
    if (cinfo->input_components != 3) {
      cinfo->err->msg_code = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_YCbCr:
    if (cinfo->input_components != 3) {
      cinfo->err->msg_code = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4) {
      cinfo->err->msg_code = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  default:
    if (cinfo->input_components < 1) {
      cinfo->err->msg_code = 10;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
  }
  switch(cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if ((cinfo->in_color_space == JCS_GRAYSCALE) || (cinfo->in_color_space == JCS_YCbCr)) {
      pjVar1->color_convert = grayscale_convert;
    }
    else if (cinfo->in_color_space == JCS_RGB) {
      pjVar1->start_pass = rgb_ycc_start;
      pjVar1->color_convert = rgb_gray_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_RGB:
    if (cinfo->num_components != 3) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space == JCS_RGB) {
      pjVar1->color_convert = rgb_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_YCbCr:
    if (cinfo->num_components != 3) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space == JCS_RGB) {
      pjVar1->start_pass = rgb_ycc_start;
      pjVar1->color_convert = rgb_ycc_convert;
    }
    else if (cinfo->in_color_space == JCS_YCbCr) {
      pjVar1->color_convert = null_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_CMYK:
    if (cinfo->num_components != 4) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space == JCS_CMYK) {
      pjVar1->color_convert = null_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  case JCS_YCCK:
    if (cinfo->num_components != 4) {
      cinfo->err->msg_code = 0xb;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    if (cinfo->in_color_space == JCS_CMYK) {
      pjVar1->start_pass = rgb_ycc_start;
      pjVar1->color_convert = cmyk_ycck_convert;
    }
    else if (cinfo->in_color_space == JCS_YCCK) {
      pjVar1->color_convert = null_convert;
    }
    else {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    break;
  default:
    if ((cinfo->jpeg_color_space != cinfo->in_color_space) ||
       (cinfo->num_components != cinfo->input_components)) {
      cinfo->err->msg_code = 0x1c;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    pjVar1->color_convert = null_convert;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_color_converter (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_converter));
  cinfo->cconvert = (struct jpeg_color_converter *) cconvert;
  /* set start_pass to null method until we find out differently */
  cconvert->pub.start_pass = null_method;

  /* Make sure input_components agrees with in_color_space */
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_RGB:
    if (cinfo->input_components != RGB_PIXELSIZE)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_YCbCr:
    if (cinfo->input_components != 3)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->input_components < 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;
  }

  /* Check num_components, set conversion method based on requested space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_GRAYSCALE ||
	cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = grayscale_convert;
    else if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_gray_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB)
      cconvert->pub.color_convert = rgb_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_ycc_convert;
    } else if (cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = cmyk_ycck_convert;
    } else if (cinfo->in_color_space == JCS_YCCK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:			/* allow null conversion of JCS_UNKNOWN */
    if (cinfo->jpeg_color_space != cinfo->in_color_space ||
	cinfo->num_components != cinfo->input_components)
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    cconvert->pub.color_convert = null_convert;
    break;
  }
}